

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall cmGraphVizWriter::Write(cmGraphVizWriter *this)

{
  cmGlobalGenerator *pcVar1;
  cmLocalGenerator *pcVar2;
  pointer puVar3;
  cmGeneratorTarget *t;
  cmLinkItem *pcVar4;
  bool bVar5;
  string *name;
  _Rb_tree_node_base *p_Var6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  undefined8 uVar9;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt;
  pointer puVar10;
  cmLinkItem *pcVar11;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  cmLinkItem *rootItem;
  cmLinkItem item;
  set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
  sortedGeneratorTargets;
  allocator<char> local_e1;
  undefined1 local_e0 [8];
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  cmGeneratorTarget *local_b8;
  size_t local_b0;
  _Base_ptr local_98;
  string local_90 [32];
  undefined1 local_70 [16];
  undefined1 local_60 [48];
  
  pcVar1 = this->GlobalGenerator;
  (*pcVar1->_vptr_cmGlobalGenerator[3])(local_d8,pcVar1);
  (*(this->super_cmLinkItemGraphVisitor)._vptr_cmLinkItemGraphVisitor[2])(this,local_d8);
  std::__cxx11::string::~string((string *)local_d8);
  local_60._24_8_ = local_60 + 8;
  local_60._8_4_ = _S_red;
  local_60._16_8_ = (pointer)0x0;
  local_60._40_8_ = 0;
  local_98 = (_Base_ptr)
             (pcVar1->LocalGenerators).
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_60._32_8_ = local_60._24_8_;
  for (p_Var8 = (_Base_ptr)
                (pcVar1->LocalGenerators).
                super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; p_Var8 != local_98;
      p_Var8 = (_Base_ptr)&p_Var8->_M_parent) {
    pcVar2 = (((__uniq_ptr_data<cmLocalGenerator,_std::default_delete<cmLocalGenerator>,_true,_true>
                *)&p_Var8->_M_color)->
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>)._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    puVar3 = (pcVar2->GeneratorTargets).
             super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar10 = *(pointer *)
                    &(pcVar2->GeneratorTargets).
                     super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                     ._M_impl; puVar10 != puVar3; puVar10 = puVar10 + 1) {
      name = cmGeneratorTarget::GetName_abi_cxx11_
                       ((cmGeneratorTarget *)
                        (puVar10->_M_t).
                        super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       );
      bVar5 = cmGlobalGenerator::IsReservedTarget(name);
      if (!bVar5) {
        local_d8._0_8_ =
             (puVar10->_M_t).
             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>;
        std::
        _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,cmGeneratorTarget::StrictTargetComparison,std::allocator<cmGeneratorTarget_const*>>
        ::_M_insert_unique<cmGeneratorTarget_const*>
                  ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,cmGeneratorTarget::StrictTargetComparison,std::allocator<cmGeneratorTarget_const*>>
                    *)local_60,(cmGeneratorTarget **)local_d8);
      }
    }
  }
  for (p_Var6 = (_Rb_tree_node_base *)local_60._24_8_;
      p_Var6 != (_Rb_tree_node_base *)(local_60 + 8);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    t = *(cmGeneratorTarget **)(p_Var6 + 1);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_70);
    cmLinkItem::cmLinkItem((cmLinkItem *)local_d8,t,false,(cmListFileBacktrace *)local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    cmLinkItemGraphVisitor::VisitItem(&this->super_cmLinkItemGraphVisitor,(cmLinkItem *)local_d8);
    cmLinkItem::~cmLinkItem((cmLinkItem *)local_d8);
  }
  if (this->GeneratePerTarget != false) {
    std::__cxx11::string::string<std::allocator<char>>(local_90,"",&local_e1);
    local_c8._8_8_ = local_d8 + 8;
    local_d8._8_4_ = _S_red;
    local_c8._M_allocated_capacity = 0;
    local_b0 = 0;
    local_b8 = (cmGeneratorTarget *)local_c8._8_8_;
    for (p_Var8 = (this->PerTargetConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        uVar9 = local_c8._8_8_,
        (_Rb_tree_header *)p_Var8 !=
        &(this->PerTargetConnections)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      pmVar7 = std::
               map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
               ::operator[]((map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                             *)local_d8,(key_type *)(p_Var8 + 1));
      FindAllConnections(this,&this->PerTargetConnections,(key_type *)(p_Var8 + 1),pmVar7);
    }
    for (; (_Rb_tree_node_base *)uVar9 != (_Rb_tree_node_base *)(local_d8 + 8);
        uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9)) {
      bVar5 = ItemExcluded(this,(cmLinkItem *)(uVar9 + 0x20));
      if (!bVar5) {
        CreateTargetFile((cmGraphVizWriter *)local_e0,(cmLinkItem *)this,(string *)(uVar9 + 0x20));
        pcVar4 = (cmLinkItem *)((_Rb_tree_node_base *)(uVar9 + 0x60))->_M_parent;
        for (pcVar11 = *(cmLinkItem **)(uVar9 + 0x60); pcVar11 != pcVar4;
            pcVar11 = (cmLinkItem *)&pcVar11[2].Target) {
          WriteNode(this,(cmGeneratedFileStream *)local_e0,pcVar11 + 1);
          WriteConnection(this,(cmGeneratedFileStream *)local_e0,pcVar11,pcVar11 + 1,
                          &pcVar11[2].String);
        }
        std::operator<<((ostream *)local_e0,"}\n");
        if (local_e0 != (undefined1  [8])0x0) {
          (*(((ofstream *)local_e0)->super_basic_ostream<char,_std::char_traits<char>_>).
            _vptr_basic_ostream[1])();
        }
      }
    }
    std::
    _Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                 *)local_d8);
    std::__cxx11::string::~string(local_90);
  }
  if (this->GenerateDependers == true) {
    std::__cxx11::string::string<std::allocator<char>>(local_90,".dependers",&local_e1);
    local_c8._8_8_ = local_d8 + 8;
    local_d8._8_4_ = _S_red;
    local_c8._M_allocated_capacity = 0;
    local_b0 = 0;
    local_b8 = (cmGeneratorTarget *)local_c8._8_8_;
    for (p_Var8 = (this->TargetDependersConnections)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left; uVar9 = local_c8._8_8_,
        (_Rb_tree_header *)p_Var8 !=
        &(this->TargetDependersConnections)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      pmVar7 = std::
               map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
               ::operator[]((map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                             *)local_d8,(key_type *)(p_Var8 + 1));
      FindAllConnections(this,&this->TargetDependersConnections,(key_type *)(p_Var8 + 1),pmVar7);
    }
    for (; (_Rb_tree_node_base *)uVar9 != (_Rb_tree_node_base *)(local_d8 + 8);
        uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9)) {
      bVar5 = ItemExcluded(this,(cmLinkItem *)(uVar9 + 0x20));
      if (!bVar5) {
        CreateTargetFile((cmGraphVizWriter *)local_e0,(cmLinkItem *)this,(string *)(uVar9 + 0x20));
        pcVar4 = (cmLinkItem *)((_Rb_tree_node_base *)(uVar9 + 0x60))->_M_parent;
        for (pcVar11 = *(cmLinkItem **)(uVar9 + 0x60); pcVar11 != pcVar4;
            pcVar11 = (cmLinkItem *)&pcVar11[2].Target) {
          WriteNode(this,(cmGeneratedFileStream *)local_e0,pcVar11 + 1);
          WriteConnection(this,(cmGeneratedFileStream *)local_e0,pcVar11 + 1,pcVar11,
                          &pcVar11[2].String);
        }
        std::operator<<((ostream *)local_e0,"}\n");
        if (local_e0 != (undefined1  [8])0x0) {
          (*(((ofstream *)local_e0)->super_basic_ostream<char,_std::char_traits<char>_>).
            _vptr_basic_ostream[1])();
        }
      }
    }
    std::
    _Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                 *)local_d8);
    std::__cxx11::string::~string(local_90);
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
               *)local_60);
  return;
}

Assistant:

void cmGraphVizWriter::Write()
{
  const auto* gg = this->GlobalGenerator;

  this->VisitGraph(gg->GetName());

  // We want to traverse in a determined order, such that the output is always
  // the same for a given project (this makes tests reproducible, etc.)
  std::set<cmGeneratorTarget const*, cmGeneratorTarget::StrictTargetComparison>
    sortedGeneratorTargets;

  for (const auto& lg : gg->GetLocalGenerators()) {
    for (const auto& gt : lg->GetGeneratorTargets()) {
      // Reserved targets have inconsistent names across platforms (e.g. 'all'
      // vs. 'ALL_BUILD'), which can disrupt the traversal ordering.
      // We don't need or want them anyway.
      if (!cmGlobalGenerator::IsReservedTarget(gt->GetName())) {
        sortedGeneratorTargets.insert(gt.get());
      }
    }
  }

  // write global data and collect all connection data for per target graphs
  for (const auto* const gt : sortedGeneratorTargets) {
    auto item = cmLinkItem(gt, false, gt->GetBacktrace());
    this->VisitItem(item);
  }

  if (this->GeneratePerTarget) {
    this->WritePerTargetConnections<DependeesDir>(this->PerTargetConnections);
  }

  if (this->GenerateDependers) {
    this->WritePerTargetConnections<DependersDir>(
      this->TargetDependersConnections, ".dependers");
  }
}